

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationCreator.hpp
# Opt level: O2

void __thiscall
OpenMD::OptimizationBuilder<QuantLib::SteepestDescent>::~OptimizationBuilder
          (OptimizationBuilder<QuantLib::SteepestDescent> *this)

{
  OptimizationCreator::~OptimizationCreator(&this->super_OptimizationCreator);
  operator_delete(this,0x28);
  return;
}

Assistant:

OptimizationBuilder(const std::string& ident) :
        OptimizationCreator(ident) {}